

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxout.cpp
# Opt level: O0

void __thiscall
AbstractTxOut_ConstractorGetterSetter_Test::TestBody
          (AbstractTxOut_ConstractorGetterSetter_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Amount AVar4;
  AssertHelper local_568;
  Message local_560;
  Script local_558;
  Script local_520;
  string local_4e8;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_7;
  Message local_4b0;
  int64_t local_4a8;
  undefined1 local_4a0;
  Amount local_498;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_468 [8];
  Amount amt;
  AbstractTxOut actual_3;
  Message local_400;
  Script local_3f8;
  Script local_3c0;
  string local_388;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_5;
  Message local_350;
  int64_t local_348;
  undefined1 local_340;
  Amount local_338;
  int64_t local_328;
  undefined1 local_320;
  Amount local_318;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_4;
  AbstractTxOut actual_2;
  Message local_2a0;
  Script local_298;
  Script local_260;
  string local_228;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_3;
  Message local_1f0;
  int64_t local_1e8;
  undefined1 local_1e0;
  int64_t local_1d8;
  undefined1 local_1d0;
  undefined1 local_1c4 [12];
  AssertionResult gtest_ar_2;
  AbstractTxOut actual_1;
  Message local_158;
  Script local_150;
  Script local_118;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  int64_t local_a0;
  undefined1 local_98;
  Amount local_80;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  AbstractTxOut actual;
  AbstractTxOut_ConstractorGetterSetter_Test *this_local;
  
  cfd::core::AbstractTxOut::AbstractTxOut
            ((AbstractTxOut *)&gtest_ar.message_,&expect_value,&expect_locking_script);
  AVar4 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&gtest_ar.message_);
  local_a0 = AVar4.amount_;
  local_98 = AVar4.ignore_check_;
  local_80.amount_ = local_a0;
  local_80.ignore_check_ = (bool)local_98;
  testing::internal::EqHelper<false>::Compare<cfd::core::Amount,cfd::core::Amount>
            ((EqHelper<false> *)local_70,"expect_value","actual.GetValue()",&expect_value,&local_80)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTxOut::GetLockingScript(&local_150,(AbstractTxOut *)&gtest_ar.message_);
  cfd::core::Script::GetScript(&local_118,&local_150);
  cfd::core::Script::GetHex_abi_cxx11_(&local_e0,&local_118);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c0,"expect_script_hex.c_str()",
             "actual.GetLockingScript().GetScript().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_e0);
  cfd::core::Script::~Script(&local_118);
  cfd::core::Script::~Script(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &actual_1.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &actual_1.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &actual_1.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  cfd::core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&gtest_ar.message_);
  cfd::core::AbstractTxOut::AbstractTxOut
            ((AbstractTxOut *)&gtest_ar_2.message_,&expect_locking_script);
  local_1c4._0_4_ = 0;
  AVar4 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&gtest_ar_2.message_);
  local_1e8 = AVar4.amount_;
  local_1e0 = AVar4.ignore_check_;
  local_1d8 = local_1e8;
  local_1d0 = local_1e0;
  testing::internal::EqHelper<true>::Compare<int,cfd::core::Amount>
            (local_1c4 + 4,"0",(int *)"actual.GetValue()",(Amount *)local_1c4,&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1c4 + 4));
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_1c4 + 4));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1c4 + 4));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTxOut::GetLockingScript(&local_298,(AbstractTxOut *)&gtest_ar_2.message_);
  cfd::core::Script::GetScript(&local_260,&local_298);
  cfd::core::Script::GetHex_abi_cxx11_(&local_228,&local_260);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_208,"expect_script_hex.c_str()",
             "actual.GetLockingScript().GetScript().GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_228);
  cfd::core::Script::~Script(&local_260);
  cfd::core::Script::~Script(&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &actual_2.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &actual_2.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &actual_2.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  cfd::core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&gtest_ar_2.message_);
  cfd::core::AbstractTxOut::AbstractTxOut((AbstractTxOut *)&gtest_ar_4.message_);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(0);
  local_328 = AVar4.amount_;
  local_320 = AVar4.ignore_check_;
  local_318.amount_ = local_328;
  local_318.ignore_check_ = (bool)local_320;
  AVar4 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&gtest_ar_4.message_);
  local_348 = AVar4.amount_;
  local_340 = AVar4.ignore_check_;
  local_338.amount_ = local_348;
  local_338.ignore_check_ = (bool)local_340;
  testing::internal::EqHelper<false>::Compare<cfd::core::Amount,cfd::core::Amount>
            ((EqHelper<false> *)local_308,"Amount::CreateBySatoshiAmount(0)","actual.GetValue()",
             &local_318,&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  cfd::core::AbstractTxOut::GetLockingScript(&local_3f8,(AbstractTxOut *)&gtest_ar_4.message_);
  cfd::core::Script::GetScript(&local_3c0,&local_3f8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_388,&local_3c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_368,"\"\"","actual.GetLockingScript().GetScript().GetHex().c_str()",
             "",pcVar2);
  std::__cxx11::string::~string((string *)&local_388);
  cfd::core::Script::~Script(&local_3c0);
  cfd::core::Script::~Script(&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &actual_3.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &actual_3.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_400);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &actual_3.locking_script_.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  cfd::core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&gtest_ar_4.message_);
  cfd::core::AbstractTxOut::AbstractTxOut((AbstractTxOut *)&amt.ignore_check_);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(10);
  gtest_ar_6.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)AVar4.amount_;
  amt.amount_._0_1_ = AVar4.ignore_check_;
  local_468 = (undefined1  [8])gtest_ar_6.message_.ptr_;
  cfd::core::AbstractTxOut::SetValue((AbstractTxOut *)&amt.ignore_check_,(Amount *)local_468);
  AVar4 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&amt.ignore_check_);
  local_4a8 = AVar4.amount_;
  local_4a0 = AVar4.ignore_check_;
  local_498.amount_ = local_4a8;
  local_498.ignore_check_ = (bool)local_4a0;
  testing::internal::EqHelper<false>::Compare<cfd::core::Amount,cfd::core::Amount>
            ((EqHelper<false> *)local_488,"amt","actual.GetValue()",(Amount *)local_468,&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  cfd::core::AbstractTxOut::GetLockingScript(&local_558,(AbstractTxOut *)&amt.ignore_check_);
  cfd::core::Script::GetScript(&local_520,&local_558);
  cfd::core::Script::GetHex_abi_cxx11_(&local_4e8,&local_520);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4c8,"\"\"","actual.GetLockingScript().GetScript().GetHex().c_str()",
             "",pcVar2);
  std::__cxx11::string::~string((string *)&local_4e8);
  cfd::core::Script::~Script(&local_520);
  cfd::core::Script::~Script(&local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  cfd::core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&amt.ignore_check_);
  return;
}

Assistant:

TEST(AbstractTxOut, ConstractorGetterSetter) {
  {
    AbstractTxOut actual = AbstractTxOut(expect_value, expect_locking_script);
    EXPECT_EQ(expect_value, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut(expect_locking_script);
    EXPECT_EQ(0, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    EXPECT_EQ(Amount::CreateBySatoshiAmount(0), actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    Amount amt = Amount::CreateBySatoshiAmount(int64_t{10});
    actual.SetValue(amt);
    EXPECT_EQ(amt, actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }
}